

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O2

bool Diligent::StreqSuff(char *RefStr,char *Str,char *Suff,bool NoSuffixAllowed)

{
  char cVar1;
  char cVar2;
  int iVar3;
  undefined7 in_register_00000009;
  bool bVar4;
  string msg;
  
  if (RefStr == (char *)0x0 || Str == (char *)0x0) {
    FormatString<char[26],char[36]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"RefStr != nullptr && Str != nullptr",
               (char (*) [36])CONCAT71(in_register_00000009,Str != (char *)0x0));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"StreqSuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringTools.hpp"
               ,0x76);
    std::__cxx11::string::~string((string *)&msg);
    if (RefStr == (char *)0x0) {
      return false;
    }
  }
  while( true ) {
    cVar1 = *RefStr;
    cVar2 = *Str;
    if (cVar1 == '\0') break;
    if (cVar2 == '\0') goto LAB_0016c3cc;
    if (cVar1 != cVar2) {
      return false;
    }
    RefStr = RefStr + 1;
    Str = Str + 1;
  }
  bVar4 = cVar2 == '\0';
  if (bVar4 && !NoSuffixAllowed) {
LAB_0016c3cc:
    bVar4 = cVar1 == '\0';
    if (Suff != (char *)0x0) {
      iVar3 = strcmp(RefStr,Suff);
      bVar4 = iVar3 == 0;
    }
  }
  return bVar4;
}

Assistant:

inline bool StreqSuff(const char* RefStr, const char* Str, const char* Suff, bool NoSuffixAllowed = false)
{
    VERIFY_EXPR(RefStr != nullptr && Str != nullptr);
    if (RefStr == nullptr)
        return false;

    const auto* r = RefStr;
    const auto* s = Str;
    // abc_def     abc
    // ^           ^
    // r           s
    for (; *r != 0 && *s != 0; ++r, ++s)
    {
        if (*r != *s)
        {
            // abc_def     abx
            //   ^           ^
            //   r           s
            return false;
        }
    }

    if (*s != 0)
    {
        // ab         abc
        //   ^          ^
        //   r          s
        VERIFY_EXPR(*r == 0);
        return false;
    }
    else
    {
        // abc_def     abc
        //    ^           ^
        //    r           s

        if (NoSuffixAllowed && *r == 0)
        {
            // abc         abc      _def
            //    ^           ^
            //    r           s
            return true;
        }

        if (Suff != nullptr)
        {
            // abc_def     abc       _def
            //    ^           ^      ^
            //    r           s      Suff
            return strcmp(r, Suff) == 0;
        }
        else
        {
            // abc         abc                abc_def         abc
            //    ^           ^       or         ^               ^
            //    r           s                  r               s
            return *r == 0;
        }
    }
}